

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int findInodeInfo(unixFile *pFile,unixInodeInfo **ppInode)

{
  unixInodeInfo *puVar1;
  int iVar2;
  sxi32 sVar3;
  int *piVar4;
  bool bVar5;
  unixInodeInfo *local_d0;
  unixInodeInfo *pInode;
  stat statbuf;
  unixFileId fileId;
  int fd;
  int rc;
  unixInodeInfo **ppInode_local;
  unixFile *pFile_local;
  
  iVar2 = fstat(pFile->h,(stat *)&pInode);
  if (iVar2 == 0) {
    SyZero(statbuf.__glibc_reserved + 2,0x10);
    statbuf.__glibc_reserved[2] = (__syscall_slong_t)pInode;
    local_d0 = inodeList;
    while( true ) {
      bVar5 = false;
      if (local_d0 != (unixInodeInfo *)0x0) {
        sVar3 = SyMemcmp(statbuf.__glibc_reserved + 2,local_d0,0x10);
        bVar5 = sVar3 != 0;
      }
      if (!bVar5) break;
      local_d0 = local_d0->pNext;
    }
    if (local_d0 == (unixInodeInfo *)0x0) {
      local_d0 = (unixInodeInfo *)unqlite_malloc(0x38);
      if (local_d0 == (unixInodeInfo *)0x0) {
        return -1;
      }
      SyZero(local_d0,0x38);
      SyMemcpy(statbuf.__glibc_reserved + 2,local_d0,0x10);
      local_d0->nRef = 1;
      local_d0->pNext = inodeList;
      local_d0->pPrev = (unixInodeInfo *)0x0;
      puVar1 = local_d0;
      if (inodeList != (unixInodeInfo *)0x0) {
        inodeList->pPrev = local_d0;
      }
    }
    else {
      local_d0->nRef = local_d0->nRef + 1;
      puVar1 = inodeList;
    }
    inodeList = puVar1;
    *ppInode = local_d0;
    pFile_local._4_4_ = 0;
  }
  else {
    piVar4 = __errno_location();
    pFile->lastErrno = *piVar4;
    if (pFile->lastErrno == 0x4b) {
      pFile_local._4_4_ = -0x11;
    }
    else {
      pFile_local._4_4_ = -2;
    }
  }
  return pFile_local._4_4_;
}

Assistant:

static int findInodeInfo(
  unixFile *pFile,               /* Unix file with file desc used in the key */
  unixInodeInfo **ppInode        /* Return the unixInodeInfo object here */
){
  int rc;                        /* System call return code */
  int fd;                        /* The file descriptor for pFile */
  struct unixFileId fileId;      /* Lookup key for the unixInodeInfo */
  struct stat statbuf;           /* Low-level file information */
  unixInodeInfo *pInode = 0;     /* Candidate unixInodeInfo object */

  /* Get low-level information about the file that we can used to
  ** create a unique name for the file.
  */
  fd = pFile->h;
  rc = fstat(fd, &statbuf);
  if( rc!=0 ){
    pFile->lastErrno = errno;
#ifdef EOVERFLOW
	if( pFile->lastErrno==EOVERFLOW ) return UNQLITE_NOTIMPLEMENTED;
#endif
    return UNQLITE_IOERR;
  }

#ifdef __APPLE__
  /* On OS X on an msdos filesystem, the inode number is reported
  ** incorrectly for zero-size files.  See ticket #3260.  To work
  ** around this problem (we consider it a bug in OS X, not SQLite)
  ** we always increase the file size to 1 by writing a single byte
  ** prior to accessing the inode number.  The one byte written is
  ** an ASCII 'S' character which also happens to be the first byte
  ** in the header of every SQLite database.  In this way, if there
  ** is a race condition such that another thread has already populated
  ** the first page of the database, no damage is done.
  */
  if( statbuf.st_size==0 && (pFile->fsFlags & UNQLITE_FSFLAGS_IS_MSDOS)!=0 ){
    rc = write(fd, "S", 1);
    if( rc!=1 ){
      pFile->lastErrno = errno;
      return UNQLITE_IOERR;
    }
    rc = fstat(fd, &statbuf);
    if( rc!=0 ){
      pFile->lastErrno = errno;
      return UNQLITE_IOERR;
    }
  }
#endif
  SyZero(&fileId,sizeof(fileId));
  fileId.dev = statbuf.st_dev;
  fileId.ino = statbuf.st_ino;
  pInode = inodeList;
  while( pInode && SyMemcmp((const void *)&fileId,(const void *)&pInode->fileId, sizeof(fileId)) ){
    pInode = pInode->pNext;
  }
  if( pInode==0 ){
    pInode = (unixInodeInfo *)unqlite_malloc( sizeof(*pInode) );
    if( pInode==0 ){
      return UNQLITE_NOMEM;
    }
    SyZero(pInode,sizeof(*pInode));
	SyMemcpy((const void *)&fileId,(void *)&pInode->fileId,sizeof(fileId));
    pInode->nRef = 1;
    pInode->pNext = inodeList;
    pInode->pPrev = 0;
    if( inodeList ) inodeList->pPrev = pInode;
    inodeList = pInode;
  }else{
    pInode->nRef++;
  }
  *ppInode = pInode;
  return UNQLITE_OK;
}